

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

int xmlXIncludeLoadFallback(xmlXIncludeCtxtPtr ctxt,xmlNodePtr fallback,xmlXIncludeRefPtr ref)

{
  int iVar1;
  xmlNodePtr pxVar2;
  
  iVar1 = -1;
  if (fallback->type != XML_NAMESPACE_DECL) {
    if (fallback->children == (_xmlNode *)0x0) {
      pxVar2 = (xmlNodePtr)0x0;
      iVar1 = 0;
    }
    else {
      iVar1 = ctxt->nbErrors;
      pxVar2 = xmlXIncludeCopyNode(ctxt,fallback,1,ref->base);
      iVar1 = -(uint)(iVar1 < ctxt->nbErrors);
    }
    ref->inc = pxVar2;
    ref->fallback = 1;
  }
  return iVar1;
}

Assistant:

static int
xmlXIncludeLoadFallback(xmlXIncludeCtxtPtr ctxt, xmlNodePtr fallback,
                        xmlXIncludeRefPtr ref) {
    int ret = 0;
    int oldNbErrors;

    if ((fallback == NULL) || (fallback->type == XML_NAMESPACE_DECL) ||
        (ctxt == NULL))
	return(-1);
    if (fallback->children != NULL) {
	/*
	 * It's possible that the fallback also has 'includes'
	 * (Bug 129969), so we re-process the fallback just in case
	 */
        oldNbErrors = ctxt->nbErrors;
	ref->inc = xmlXIncludeCopyNode(ctxt, fallback, 1, ref->base);
	if (ctxt->nbErrors > oldNbErrors)
	    ret = -1;
    } else {
        ref->inc = NULL;
    }
    ref->fallback = 1;
    return(ret);
}